

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O0

void __thiscall StringTest::Test11(StringTest *this)

{
  int iVar1;
  allocator<char> local_69;
  uint i;
  string t2;
  allocator<char> local_31;
  string local_30 [8];
  string t1;
  StringTest *this_local;
  
  t1.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"This is y a sentence with vowels.",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"aeiou",&local_69);
  std::allocator<char>::~allocator(&local_69);
  iVar1 = std::__cxx11::string::find_last_of(local_30,(ulong)&i);
  if (iVar1 != 0x1d) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2a4,"Failed to find first vowel");
  }
  iVar1 = std::__cxx11::string::find_last_of(local_30,(ulong)&i);
  if (iVar1 != 0x1d) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2ab,"Failed to find first vowel");
  }
  iVar1 = std::__cxx11::string::find_last_of(local_30,(ulong)&i);
  if (iVar1 != 0x1b) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2b2,"Failed to find second vowel");
  }
  iVar1 = std::__cxx11::string::find_last_of((char *)local_30,0x10ba12);
  if (iVar1 != 0x16) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2b9,"Failed to find second vowel");
  }
  iVar1 = std::__cxx11::string::find_last_of((char *)local_30,0x10ba4f,9);
  if (iVar1 != 5) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2c0,"Failed to find third vowel");
  }
  iVar1 = std::__cxx11::string::find_last_of((char)local_30,0x79);
  if (iVar1 != 8) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2c7,"Failed to find \'y\'");
  }
  iVar1 = std::__cxx11::string::find_last_of((char)local_30,0x73);
  if (iVar1 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2ce,"Failed to find \'s\'");
  }
  iVar1 = std::__cxx11::string::find_last_of((char)local_30,0x73);
  if (iVar1 != 6) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2d5,"Failed to find \'s\'");
  }
  TestCase::TestPassed(&this->super_TestCase);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Test11()
	{
		// find_first_of
		string t1 = "This is y a sentence with vowels.";
		string t2 = "aeiou";
		
		unsigned i = t1.find_last_of( t2 );
		
		LOG_NOTICE( "i is %d", i );
		
		if ( i != 29 )
			TestFailed( "Failed to find first vowel" );

		i = t1.find_last_of( t2, 29 );

		LOG_NOTICE( "i is %d", i );

		if ( i != 29 )
			TestFailed( "Failed to find first vowel" );

		i = t1.find_last_of( t2, 28 );

		LOG_NOTICE( "i is %d", i );

		if ( i != 27 )
			TestFailed( "Failed to find second vowel" );

		i = t1.find_last_of( "aeiou", 26 );

		LOG_NOTICE( "i is %d", i );

		if ( i != 22 )
			TestFailed( "Failed to find second vowel" );

		i = t1.find_last_of( "aeiouy", 9, 5 );

		LOG_NOTICE( "i is %d", i );

		if ( i != 5 )
			TestFailed( "Failed to find third vowel" );

		i = t1.find_last_of( 'y' );

		LOG_NOTICE( "i is %d", i );

		if ( i != 8 )
			TestFailed( "Failed to find \'y\'" );

		i = t1.find_last_of( 's' );

		LOG_NOTICE( "i is %d", i );

		if ( i != 31 )
			TestFailed( "Failed to find \'s\'" );

		i = t1.find_last_of( 's', 8 );

		LOG_NOTICE( "i is %d", i );

		if ( i != 6 )
			TestFailed( "Failed to find \'s\'" );
		
		TestPassed();
	}